

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QList<QMdiSubWindow_*> * __thiscall
QMdiAreaPrivate::subWindowList
          (QList<QMdiSubWindow_*> *__return_storage_ptr__,QMdiAreaPrivate *this,WindowOrder order,
          bool reversed)

{
  int iVar1;
  long lVar2;
  QPointer<QMdiSubWindow> *pQVar3;
  parameter_type t;
  Data *pDVar4;
  QObject *t_00;
  bool bVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  parameter_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QMdiSubWindow **)0x0;
  lVar2 = (this->childWindows).d.size;
  if (lVar2 != 0) {
    if (order == StackingOrder) {
      lVar2 = *(long *)&((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8;
      lVar7 = *(long *)(lVar2 + 0x20);
      lVar2 = *(long *)(lVar2 + 0x28);
      for (lVar6 = 0; lVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
        local_40 = QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>
                             (*(QObject **)(lVar7 + lVar6));
        if (local_40 != (QMdiSubWindow *)0x0) {
          bVar5 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::contains<QMdiSubWindow*>
                            ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>> *)&this->childWindows
                             ,&local_40);
          if (bVar5) {
            if (reversed) {
              QList<QMdiSubWindow_*>::prepend(__return_storage_ptr__,local_40);
            }
            else {
              QList<QMdiSubWindow_*>::append(__return_storage_ptr__,local_40);
            }
          }
        }
      }
    }
    else if (order == CreationOrder) {
      pQVar3 = (this->childWindows).d.ptr;
      for (lVar7 = 0; lVar2 << 4 != lVar7; lVar7 = lVar7 + 0x10) {
        lVar6 = *(long *)((long)&(pQVar3->wp).d + lVar7);
        if (((lVar6 != 0) && (*(int *)(lVar6 + 4) != 0)) &&
           (t = *(parameter_type *)((long)&(pQVar3->wp).value + lVar7), t != (parameter_type)0x0)) {
          if (reversed) {
            QList<QMdiSubWindow_*>::prepend(__return_storage_ptr__,t);
          }
          else {
            QList<QMdiSubWindow_*>::append(__return_storage_ptr__,t);
          }
        }
      }
    }
    else {
      uVar8 = (uint)(this->indicesToActivatedChildren).d.size;
      while( true ) {
        uVar8 = uVar8 - 1;
        if ((int)uVar8 < 0) break;
        pQVar3 = (this->childWindows).d.ptr;
        iVar1 = (this->indicesToActivatedChildren).d.ptr[uVar8 & 0x7fffffff];
        pDVar4 = pQVar3[iVar1].wp.d;
        if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
           (t_00 = pQVar3[iVar1].wp.value, t_00 != (QObject *)0x0)) {
          if (reversed) {
            QList<QMdiSubWindow_*>::prepend(__return_storage_ptr__,(parameter_type)t_00);
          }
          else {
            QList<QMdiSubWindow_*>::append(__return_storage_ptr__,(parameter_type)t_00);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QMdiSubWindow*>
QMdiAreaPrivate::subWindowList(QMdiArea::WindowOrder order, bool reversed) const
{
    QList<QMdiSubWindow *> list;
    if (childWindows.isEmpty())
        return list;

    if (order == QMdiArea::CreationOrder) {
        for (QMdiSubWindow *child : childWindows) {
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else if (order == QMdiArea::StackingOrder) {
        for (QObject *object : viewport->children()) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    } else { // ActivationHistoryOrder
        Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());
        for (int i = indicesToActivatedChildren.size() - 1; i >= 0; --i) {
            QMdiSubWindow *child = childWindows.at(indicesToActivatedChildren.at(i));
            if (!child)
                continue;
            if (!reversed)
                list.append(child);
            else
                list.prepend(child);
        }
    }
    return list;
}